

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20240722::Cord::DestroyCordSlow(Cord *this)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  Nullable<CordRep_*> node;
  CordzInfo *pCVar3;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("contents_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x16b,"void absl::Cord::DestroyCordSlow()");
  }
  pCVar3 = cord_internal::InlineData::cordz_info((InlineData *)this);
  if (pCVar3 != (CordzInfo *)0x0) {
    absl::lts_20240722::cord_internal::CordzInfo::Untrack();
  }
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("data_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                  ,0x4d5,
                  "absl::Nonnull<absl::cord_internal::CordRep *> absl::Cord::InlineRep::as_tree() const"
                 );
  }
  node = (this->contents_).data_.rep_.field_0.as_tree.rep;
  VerifyTree(node);
  if (node == (Nullable<CordRep_*>)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x376,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
  }
  LOCK();
  pRVar1 = &node->refcount;
  uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
  (pRVar1->count_).super___atomic_base<int>._M_i =
       (pRVar1->count_).super___atomic_base<int>._M_i + -2;
  UNLOCK();
  if ((uVar2 & 1) != 0 || 0 < (int)uVar2) {
    if (uVar2 != 2) {
      return;
    }
    absl::lts_20240722::cord_internal::CordRep::Destroy(node);
    return;
  }
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

void Cord::DestroyCordSlow() {
  assert(contents_.is_tree());
  CordzInfo::MaybeUntrackCord(contents_.cordz_info());
  CordRep::Unref(VerifyTree(contents_.as_tree()));
}